

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O0

bool spvtools::utils::CheckRangeAndIfHexThenSignExtend<long>
               (long value,NumberType *type,bool is_hex,long *updated_value_for_hex)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  bool local_69;
  ulong local_68;
  uint64_t value_as_u64;
  bool failed;
  uint64_t overflow_mask;
  uint64_t sign_mask;
  uint64_t magnitude_mask;
  uint32_t bit_width;
  long *updated_value_for_hex_local;
  bool is_hex_local;
  NumberType *type_local;
  long value_local;
  
  iVar2 = AssumedBitWidth(type);
  if (iVar2 == 0x40) {
    local_68 = 0xffffffffffffffff;
  }
  else {
    local_68 = (1L << ((byte)iVar2 & 0x3f)) - 1;
  }
  sign_mask = local_68;
  overflow_mask = 0;
  uVar3 = local_68 ^ 0xffffffffffffffff;
  if ((value < 0) || (bVar1 = IsSigned(type), bVar1)) {
    sign_mask = local_68 >> 1;
    overflow_mask = sign_mask + 1;
  }
  if (value < 0) {
    local_69 = (value & uVar3) != uVar3 || (value & overflow_mask) != overflow_mask;
  }
  else if (is_hex) {
    local_69 = (value & uVar3) != 0;
  }
  else {
    local_69 = (value & sign_mask) != value;
  }
  if (local_69) {
    value_local._7_1_ = false;
  }
  else {
    if ((is_hex) && ((value & overflow_mask) != 0)) {
      *updated_value_for_hex = value | uVar3;
    }
    value_local._7_1_ = true;
  }
  return value_local._7_1_;
}

Assistant:

bool CheckRangeAndIfHexThenSignExtend(T value, const NumberType& type,
                                      bool is_hex, T* updated_value_for_hex) {
  // The encoded result has three regions of bits that are of interest, from
  // least to most significant:
  //   - magnitude bits, where the magnitude of the number would be stored if
  //     we were using a signed-magnitude representation.
  //   - an optional sign bit
  //   - overflow bits, up to bit 63 of a 64-bit number
  // For example:
  //   Type                Overflow      Sign       Magnitude
  //   ---------------     --------      ----       ---------
  //   unsigned 8 bit      8-63          n/a        0-7
  //   signed 8 bit        8-63          7          0-6
  //   unsigned 16 bit     16-63         n/a        0-15
  //   signed 16 bit       16-63         15         0-14

  // We'll use masks to define the three regions.
  // At first we'll assume the number is unsigned.
  const uint32_t bit_width = AssumedBitWidth(type);
  uint64_t magnitude_mask =
      (bit_width == 64) ? -1 : ((uint64_t(1) << bit_width) - 1);
  uint64_t sign_mask = 0;
  uint64_t overflow_mask = ~magnitude_mask;

  if (value < 0 || IsSigned(type)) {
    // Accommodate the sign bit.
    magnitude_mask >>= 1;
    sign_mask = magnitude_mask + 1;
  }

  bool failed = false;
  if (value < 0) {
    // The top bits must all be 1 for a negative signed value.
    failed = ((value & overflow_mask) != overflow_mask) ||
             ((value & sign_mask) != sign_mask);
  } else {
    if (is_hex) {
      // Hex values are a bit special. They decode as unsigned values, but may
      // represent a negative number. In this case, the overflow bits should
      // be zero.
      failed = (value & overflow_mask) != 0;
    } else {
      const uint64_t value_as_u64 = static_cast<uint64_t>(value);
      // Check overflow in the ordinary case.
      failed = (value_as_u64 & magnitude_mask) != value_as_u64;
    }
  }

  if (failed) {
    return false;
  }

  // Sign extend hex the number.
  if (is_hex && (value & sign_mask))
    *updated_value_for_hex = (value | overflow_mask);

  return true;
}